

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool pmsav8_mpu_lookup_arm
                (CPUARMState *env,uint32_t address,MMUAccessType access_type,ARMMMUIdx mmu_idx,
                hwaddr *phys_ptr,MemTxAttrs *txattrs,int *prot,_Bool *is_subpage,
                ARMMMUFaultInfo_conflict *fi,uint32_t *mregion)

{
  uc_struct_conflict1 *puVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint32_t ap_00;
  int iVar9;
  ArchCPU_conflict *cpu_00;
  uint32_t local_74;
  uint32_t xn;
  uint32_t ap;
  uint32_t limit;
  uint32_t base;
  uint32_t addr_page_limit;
  uint32_t addr_page_base;
  uint32_t uStack_54;
  _Bool hit;
  int matchregion;
  int n;
  uint32_t secure;
  _Bool is_user;
  ARMCPU *cpu;
  uc_struct_conflict1 *uc;
  MemTxAttrs *txattrs_local;
  hwaddr *phys_ptr_local;
  ARMMMUIdx mmu_idx_local;
  MMUAccessType access_type_local;
  uint32_t address_local;
  CPUARMState *env_local;
  
  puVar1 = env->uc;
  cpu_00 = env_archcpu(env);
  _Var2 = regime_is_user(env,mmu_idx);
  _Var3 = regime_is_secure(env,mmu_idx);
  uVar4 = (uint)_Var3;
  addr_page_base = 0xffffffff;
  uVar5 = address & puVar1->init_target_page->mask;
  iVar9 = puVar1->init_target_page->mask;
  *is_subpage = false;
  *phys_ptr = (ulong)address;
  *prot = 0;
  if (mregion != (uint32_t *)0x0) {
    *mregion = 0xffffffff;
  }
  _Var3 = regime_translation_disabled(env,mmu_idx);
  if (_Var3) {
    addr_page_limit._3_1_ = true;
  }
  else {
    _Var3 = m_is_ppb_region(env,address);
    if (_Var3) {
      addr_page_limit._3_1_ = true;
    }
    else {
      addr_page_limit._3_1_ = pmsav7_use_background_region(cpu_00,mmu_idx,_Var2);
      uStack_54 = cpu_00->pmsav7_dregion;
      while (uStack_54 = uStack_54 - 1, -1 < (int)uStack_54) {
        uVar6 = (env->pmsav8).rbar[uVar4][(int)uStack_54] & 0xffffffe0;
        uVar7 = (env->pmsav8).rlar[uVar4][(int)uStack_54] | 0x1f;
        if (((env->pmsav8).rlar[uVar4][(int)uStack_54] & 1) != 0) {
          if ((address < uVar6) || (uVar7 < address)) {
            if ((uVar6 <= uVar7) &&
               (iVar8 = ranges_overlap((ulong)uVar6,(ulong)((uVar7 - uVar6) + 1),(ulong)uVar5,
                                       (long)-puVar1->init_target_page->mask), iVar8 != 0)) {
              *is_subpage = true;
            }
          }
          else {
            if ((uVar5 < uVar6) || (uVar7 < uVar5 + (-1 - iVar9))) {
              *is_subpage = true;
            }
            if (addr_page_base != 0xffffffff) {
              fi->type = ARMFault_Permission;
              *(undefined4 *)((long)&fi->s2addr + 4) = 1;
              return true;
            }
            addr_page_base = uStack_54;
            addr_page_limit._3_1_ = true;
          }
        }
      }
    }
  }
  if (addr_page_limit._3_1_ == false) {
    fi->type = ARMFault_Background;
    env_local._7_1_ = true;
  }
  else {
    if (addr_page_base == 0xffffffff) {
      get_phys_addr_pmsav7_default(env,mmu_idx,address,prot);
    }
    else {
      ap_00 = extract32((env->pmsav8).rbar[uVar4][(int)addr_page_base],1,2);
      local_74 = extract32((env->pmsav8).rbar[uVar4][(int)addr_page_base],0,1);
      _Var2 = m_is_system_region(env,address);
      if (_Var2) {
        local_74 = 1;
      }
      iVar9 = simple_ap_to_rw_prot(env,mmu_idx,ap_00);
      *prot = iVar9;
      if ((*prot != 0) && (local_74 == 0)) {
        *prot = *prot | 4;
      }
      if (mregion != (uint32_t *)0x0) {
        *mregion = addr_page_base;
      }
    }
    fi->type = ARMFault_Permission;
    *(undefined4 *)((long)&fi->s2addr + 4) = 1;
    env_local._7_1_ = (*prot & 1 << ((byte)access_type & 0x1f)) == 0;
  }
  return env_local._7_1_;
}

Assistant:

bool pmsav8_mpu_lookup(CPUARMState *env, uint32_t address,
                              MMUAccessType access_type, ARMMMUIdx mmu_idx,
                              hwaddr *phys_ptr, MemTxAttrs *txattrs,
                              int *prot, bool *is_subpage,
                              ARMMMUFaultInfo *fi, uint32_t *mregion)
{
    struct uc_struct *uc = env->uc;
    /* Perform a PMSAv8 MPU lookup (without also doing the SAU check
     * that a full phys-to-virt translation does).
     * mregion is (if not NULL) set to the region number which matched,
     * or -1 if no region number is returned (MPU off, address did not
     * hit a region, address hit in multiple regions).
     * We set is_subpage to true if the region hit doesn't cover the
     * entire TARGET_PAGE the address is within.
     */
    ARMCPU *cpu = env_archcpu(env);
    bool is_user = regime_is_user(env, mmu_idx);
    uint32_t secure = regime_is_secure(env, mmu_idx);
    int n;
    int matchregion = -1;
    bool hit = false;
    uint32_t addr_page_base = address & TARGET_PAGE_MASK;
    uint32_t addr_page_limit = addr_page_base + (TARGET_PAGE_SIZE - 1);

    *is_subpage = false;
    *phys_ptr = address;
    *prot = 0;
    if (mregion) {
        *mregion = -1;
    }

    /* Unlike the ARM ARM pseudocode, we don't need to check whether this
     * was an exception vector read from the vector table (which is always
     * done using the default system address map), because those accesses
     * are done in arm_v7m_load_vector(), which always does a direct
     * read using address_space_ldl(), rather than going via this function.
     */
    if (regime_translation_disabled(env, mmu_idx)) { /* MPU disabled */
        hit = true;
    } else if (m_is_ppb_region(env, address)) {
        hit = true;
    } else {
        if (pmsav7_use_background_region(cpu, mmu_idx, is_user)) {
            hit = true;
        }

        for (n = (int)cpu->pmsav7_dregion - 1; n >= 0; n--) {
            /* region search */
            /* Note that the base address is bits [31:5] from the register
             * with bits [4:0] all zeroes, but the limit address is bits
             * [31:5] from the register with bits [4:0] all ones.
             */
            uint32_t base = env->pmsav8.rbar[secure][n] & ~0x1f;
            uint32_t limit = env->pmsav8.rlar[secure][n] | 0x1f;

            if (!(env->pmsav8.rlar[secure][n] & 0x1)) {
                /* Region disabled */
                continue;
            }

            if (address < base || address > limit) {
                /*
                 * Address not in this region. We must check whether the
                 * region covers addresses in the same page as our address.
                 * In that case we must not report a size that covers the
                 * whole page for a subsequent hit against a different MPU
                 * region or the background region, because it would result in
                 * incorrect TLB hits for subsequent accesses to addresses that
                 * are in this MPU region.
                 */
                if (limit >= base &&
                    ranges_overlap(base, limit - base + 1,
                                   addr_page_base,
                                   TARGET_PAGE_SIZE)) {
                    *is_subpage = true;
                }
                continue;
            }

            if (base > addr_page_base || limit < addr_page_limit) {
                *is_subpage = true;
            }

            if (matchregion != -1) {
                /* Multiple regions match -- always a failure (unlike
                 * PMSAv7 where highest-numbered-region wins)
                 */
                fi->type = ARMFault_Permission;
                fi->level = 1;
                return true;
            }

            matchregion = n;
            hit = true;
        }
    }

    if (!hit) {
        /* background fault */
        fi->type = ARMFault_Background;
        return true;
    }

    if (matchregion == -1) {
        /* hit using the background region */
        get_phys_addr_pmsav7_default(env, mmu_idx, address, prot);
    } else {
        uint32_t ap = extract32(env->pmsav8.rbar[secure][matchregion], 1, 2);
        uint32_t xn = extract32(env->pmsav8.rbar[secure][matchregion], 0, 1);

        if (m_is_system_region(env, address)) {
            /* System space is always execute never */
            xn = 1;
        }

        *prot = simple_ap_to_rw_prot(env, mmu_idx, ap);
        if (*prot && !xn) {
            *prot |= PAGE_EXEC;
        }
        /* We don't need to look the attribute up in the MAIR0/MAIR1
         * registers because that only tells us about cacheability.
         */
        if (mregion) {
            *mregion = matchregion;
        }
    }

    fi->type = ARMFault_Permission;
    fi->level = 1;
    return !(*prot & (1 << access_type));
}